

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_certificate.cc
# Opt level: O1

bool __thiscall
bssl::ParseCrlDistributionPoints
          (bssl *this,Input extension_value,
          vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
          *distribution_points)

{
  pointer pPVar1;
  pointer pPVar2;
  unique_ptr<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_> this_00;
  bool bVar3;
  vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_> *this_01;
  bool bVar4;
  pointer this_02;
  Input general_names_value;
  Input input;
  ParsedDistributionPoint distribution_point;
  optional<bssl::der::Input> der_full_name;
  Parser parser;
  Parser distribution_points_parser;
  CertErrors errors;
  Parser extension_value_parser;
  Parser distrib_point_parser;
  _Head_base<0UL,_bssl::GeneralNames_*,_false> local_130;
  _Storage<bssl::der::Input,_true> local_128;
  char local_118;
  ParsedDistributionPoint local_110;
  _Storage<bssl::der::Input,_true> local_c0;
  char local_b0;
  Parser local_a8;
  Parser local_90;
  CertErrors local_78;
  Parser local_60;
  Parser local_48;
  
  this_01 = (vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_> *
            )extension_value.data_.size_;
  pPVar1 = (this_01->
           super__Vector_base<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pPVar2 = (this_01->
           super__Vector_base<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  this_02 = pPVar1;
  if (pPVar2 != pPVar1) {
    do {
      ::std::unique_ptr<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>::~unique_ptr
                (&this_02->distribution_point_fullname);
      this_02 = this_02 + 1;
    } while (this_02 != pPVar2);
    (this_01->
    super__Vector_base<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
    )._M_impl.super__Vector_impl_data._M_finish = pPVar1;
  }
  input.data_.size_ = (size_t)extension_value.data_.data_;
  input.data_.data_ = (uchar *)this;
  der::Parser::Parser(&local_60,input);
  der::Parser::Parser(&local_90);
  bVar3 = der::Parser::ReadSequence(&local_60,&local_90);
  if (((!bVar3) || (bVar3 = der::Parser::HasMore(&local_60), bVar3)) ||
     (bVar3 = der::Parser::HasMore(&local_90), !bVar3)) {
LAB_004b267c:
    bVar4 = false;
  }
  else {
    bVar3 = der::Parser::HasMore(&local_90);
    bVar4 = true;
    if (bVar3) {
      do {
        local_110.distribution_point_fullname._M_t.
        super___uniq_ptr_impl<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>._M_t.
        super__Tuple_impl<0UL,_bssl::GeneralNames_*,_std::default_delete<bssl::GeneralNames>_>.
        super__Head_base<0UL,_bssl::GeneralNames_*,_false>._M_head_impl =
             (__uniq_ptr_data<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>,_true,_true>
              )(__uniq_ptr_impl<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>)0x0;
        local_110.distribution_point_name_relative_to_crl_issuer.
        super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
        super__Optional_payload_base<bssl::der::Input>._M_engaged = false;
        local_110.reasons.super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
        super__Optional_payload_base<bssl::der::Input>._M_engaged = false;
        local_110.crl_issuer.super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
        super__Optional_payload_base<bssl::der::Input>._M_engaged = false;
        der::Parser::Parser(&local_48);
        bVar3 = der::Parser::ReadSequence(&local_90,&local_48);
        if (!bVar3) {
LAB_004b2672:
          ::std::unique_ptr<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>::
          ~unique_ptr(&local_110.distribution_point_fullname);
          goto LAB_004b267c;
        }
        local_118 = '\0';
        bVar3 = der::Parser::ReadOptionalTag
                          (&local_48,0xa0000000,(optional<bssl::der::Input> *)&local_128._M_value);
        if (!bVar3) goto LAB_004b2672;
        if (local_118 == '\x01') {
          der::Parser::Parser(&local_a8,local_128._M_value.data_);
          local_b0 = '\0';
          bVar3 = der::Parser::ReadOptionalTag
                            (&local_a8,0xa0000000,(optional<bssl::der::Input> *)&local_c0._M_value);
          if (bVar3) {
            if (local_b0 == '\x01') {
              CertErrors::CertErrors(&local_78);
              general_names_value.data_.size_ = (size_t)local_c0._M_value.data_.data_;
              general_names_value.data_.data_ = (uchar *)&local_130;
              GeneralNames::CreateFromValue
                        (general_names_value,(CertErrors *)local_c0._M_value.data_.size_);
              this_00._M_t.
              super___uniq_ptr_impl<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>.
              _M_t.
              super__Tuple_impl<0UL,_bssl::GeneralNames_*,_std::default_delete<bssl::GeneralNames>_>
              .super__Head_base<0UL,_bssl::GeneralNames_*,_false>._M_head_impl =
                   (__uniq_ptr_data<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>,_true,_true>
                    )(__uniq_ptr_data<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>,_true,_true>
                      )local_110.distribution_point_fullname;
              local_110.distribution_point_fullname._M_t.
              super___uniq_ptr_impl<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>.
              _M_t.
              super__Tuple_impl<0UL,_bssl::GeneralNames_*,_std::default_delete<bssl::GeneralNames>_>
              .super__Head_base<0UL,_bssl::GeneralNames_*,_false>._M_head_impl =
                   (__uniq_ptr_data<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>,_true,_true>
                    )(__uniq_ptr_data<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>,_true,_true>
                      )local_130._M_head_impl;
              local_130._M_head_impl = (GeneralNames *)0x0;
              if (this_00._M_t.
                  super___uniq_ptr_impl<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_bssl::GeneralNames_*,_std::default_delete<bssl::GeneralNames>_>
                  .super__Head_base<0UL,_bssl::GeneralNames_*,_false>._M_head_impl !=
                  (__uniq_ptr_impl<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>)0x0
                 ) {
                GeneralNames::~GeneralNames
                          ((GeneralNames *)
                           this_00._M_t.
                           super___uniq_ptr_impl<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_bssl::GeneralNames_*,_std::default_delete<bssl::GeneralNames>_>
                           .super__Head_base<0UL,_bssl::GeneralNames_*,_false>._M_head_impl);
                operator_delete((void *)this_00._M_t.
                                        super___uniq_ptr_impl<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_bssl::GeneralNames_*,_std::default_delete<bssl::GeneralNames>_>
                                        .super__Head_base<0UL,_bssl::GeneralNames_*,_false>.
                                        _M_head_impl,0xf8);
              }
              ::std::unique_ptr<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>::
              ~unique_ptr((unique_ptr<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>
                           *)&local_130);
              if ((_Tuple_impl<0UL,_bssl::GeneralNames_*,_std::default_delete<bssl::GeneralNames>_>)
                  local_110.distribution_point_fullname._M_t.
                  super___uniq_ptr_impl<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_bssl::GeneralNames_*,_std::default_delete<bssl::GeneralNames>_>
                  .super__Head_base<0UL,_bssl::GeneralNames_*,_false>._M_head_impl ==
                  (GeneralNames *)0x0) {
                bVar3 = false;
              }
              else {
                bVar3 = der::Parser::HasMore(&local_a8);
                bVar3 = !bVar3;
              }
              CertErrors::~CertErrors(&local_78);
            }
            else {
              bVar3 = der::Parser::ReadOptionalTag
                                (&local_a8,0xa0000001,
                                 &local_110.distribution_point_name_relative_to_crl_issuer);
              if ((!bVar3) ||
                 (local_110.distribution_point_name_relative_to_crl_issuer.
                  super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                  super__Optional_payload_base<bssl::der::Input>._M_engaged != true))
              goto LAB_004b2672;
              bVar3 = der::Parser::HasMore(&local_a8);
              bVar3 = !bVar3;
            }
            if (bVar3) goto LAB_004b2603;
          }
          goto LAB_004b2672;
        }
LAB_004b2603:
        bVar3 = der::Parser::ReadOptionalTag(&local_48,0x80000001,&local_110.reasons);
        if ((((!bVar3) ||
             (bVar3 = der::Parser::ReadOptionalTag(&local_48,0xa0000002,&local_110.crl_issuer),
             !bVar3)) ||
            ((local_118 == '\0' &&
             (local_110.crl_issuer.super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
              super__Optional_payload_base<bssl::der::Input>._M_engaged != true)))) ||
           (bVar3 = der::Parser::HasMore(&local_48), bVar3)) goto LAB_004b2672;
        ::std::vector<bssl::ParsedDistributionPoint,_std::allocator<bssl::ParsedDistributionPoint>_>
        ::emplace_back<bssl::ParsedDistributionPoint>(this_01,&local_110);
        ::std::unique_ptr<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>::~unique_ptr
                  (&local_110.distribution_point_fullname);
        bVar3 = der::Parser::HasMore(&local_90);
      } while (bVar3);
    }
  }
  return bVar4;
}

Assistant:

bool ParseCrlDistributionPoints(
    der::Input extension_value,
    std::vector<ParsedDistributionPoint> *distribution_points) {
  distribution_points->clear();

  // RFC 5280, section 4.2.1.13.
  //
  // CRLDistributionPoints ::= SEQUENCE SIZE (1..MAX) OF DistributionPoint
  der::Parser extension_value_parser(extension_value);
  der::Parser distribution_points_parser;
  if (!extension_value_parser.ReadSequence(&distribution_points_parser)) {
    return false;
  }
  if (extension_value_parser.HasMore()) {
    return false;
  }

  // Sequence must have a minimum of 1 item.
  if (!distribution_points_parser.HasMore()) {
    return false;
  }

  while (distribution_points_parser.HasMore()) {
    if (!ParseAndAddDistributionPoint(&distribution_points_parser,
                                      distribution_points)) {
      return false;
    }
  }

  return true;
}